

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

CWalletTx * __thiscall
wallet::CWallet::AddToWallet
          (CWallet *this,CTransactionRef tx,TxState *state,UpdateWalletTxFn *update_wtx,
          bool fFlushOnClose,bool rescanning_old_block)

{
  variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  *pvVar1;
  byte bVar2;
  long lVar3;
  element_type *peVar4;
  pointer pCVar5;
  CWalletTx *wtx;
  undefined8 uVar6;
  undefined8 uVar7;
  _func_int **pp_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  WalletDatabase *pWVar16;
  _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> _Var17;
  int64_t iVar18;
  iterator iVar19;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var20;
  iterator iVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var22;
  CTxIn *txin;
  pointer hash_00;
  CWalletTx *__args;
  element_type *peVar23;
  ulong uVar24;
  const_iterator it;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_bool>
  pVar25;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar26;
  initializer_list<wallet::CWalletTx_*> __l;
  TxStateInactive inactive_state;
  undefined7 uStack_107;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_100;
  WalletBatch local_f0;
  anon_class_1_0_00000001 local_d9;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  string local_c8;
  vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_> txs;
  string strCmd;
  uint256 hash;
  
  _Var22 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar23 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock22,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x42c,false);
  pWVar16 = GetDatabase(this);
  (*pWVar16->_vptr_WalletDatabase[0xe])(&local_f0,pWVar16,(ulong)update_wtx & 0xff);
  peVar4 = (element_type *)
           (peVar23->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  hash.super_base_blob<256U>.m_data._M_elems._0_4_ =
       *(undefined4 *)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  hash.super_base_blob<256U>.m_data._M_elems._4_4_ =
       *(undefined4 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 4);
  hash.super_base_blob<256U>.m_data._M_elems._8_4_ =
       *(undefined4 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  hash.super_base_blob<256U>.m_data._M_elems._12_4_ =
       *(undefined4 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  local_f0.m_database = pWVar16;
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 1) != 0) {
    strCmd.field_2._8_8_ = &strCmd._M_string_length;
    strCmd._M_string_length = (ulong)strCmd._M_string_length._4_4_ << 0x20;
    strCmd.field_2._M_allocated_capacity = 0;
    peVar4 = (element_type *)
             (peVar23->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar5 = (peVar4->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (hash_00 = (peVar4->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start; hash_00 != pCVar5; hash_00 = hash_00 + 1) {
      SetSpentKeyState(this,&local_f0,(uint256 *)hash_00,(hash_00->prevout).n,true,
                       (set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                        *)&strCmd);
    }
    MarkDestinationsDirty
              (this,(set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                     *)&strCmd);
    std::
    _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
    ::~_Rb_tree((_Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                 *)&strCmd);
  }
  txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&hash;
  strCmd._M_dataplus._M_p = (pointer)_Var22._M_pi;
  strCmd._M_string_length = (size_type)peVar23;
  pVar25 = std::
           _Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
           ::
           _M_emplace<std::piecewise_construct_t_const&,std::tuple<uint256&>,std::tuple<std::shared_ptr<CTransaction_const>&,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>const&>>
                     ((_Hashtable<uint256,std::pair<uint256_const,wallet::CWalletTx>,std::allocator<std::pair<uint256_const,wallet::CWalletTx>>,std::__detail::_Select1st,std::equal_to<uint256>,SaltedTxidHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                       *)&this->mapWallet,&std::piecewise_construct);
  _Var17 = pVar25.first.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
           ._M_cur;
  __args = (CWalletTx *)
           ((long)_Var17.
                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                  _M_cur + 0x28);
  if (*(long *)((long)&(state->
                       super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       ).
                       super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       .
                       super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                       ._M_u + 0x10) == 0) {
    bVar11 = false;
  }
  else {
    bVar11 = std::function<bool_(wallet::CWalletTx_&,_bool)>::operator()
                       ((function<bool_(wallet::CWalletTx_&,_bool)> *)state,__args,
                        (bool)(pVar25.second & 1));
  }
  if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar2 = (byte)_Var22._M_pi[2]._M_use_count;
    pvVar1 = (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)((long)_Var17.
                       super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                       _M_cur + 0x1d0);
    if (bVar2 == *(byte *)((long)_Var17.
                                 super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                 ._M_cur + 0x1f8)) {
      iVar14 = (*std::__detail::__variant::
                 __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                 ::_S_vtable._M_arr[bVar2]._M_data)
                         ((Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:118:9)>
                           *)&strCmd,pvVar1);
      iVar15 = (*std::__detail::__variant::
                 __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                 ::_S_vtable._M_arr[(byte)_Var22._M_pi[2]._M_use_count]._M_data)
                         ((Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:118:9)>
                           *)&strCmd,
                          (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                           *)_Var22._M_pi);
      if (iVar14 != iVar15) {
        __assert_fail("TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x454,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr
        [*(byte *)((long)_Var17.
                         super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                         ._M_cur + 0x1f8)]._M_data)
                ((uint256 *)&strCmd,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&txs,pvVar1);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr[(byte)_Var22._M_pi[2]._M_use_count]._M_data)
                ((uint256 *)&txs,
                 (Overloaded<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_brunoerg[P]bitcoin_src_wallet_transaction_h:106:9)>
                  *)&local_c8,
                 (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  *)_Var22._M_pi);
      bVar12 = ::operator==((base_blob<256U> *)&strCmd,(base_blob<256U> *)&txs);
      if (!bVar12) {
        __assert_fail("TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                      ,0x455,
                      "CWalletTx *wallet::CWallet::AddToWallet(CTransactionRef, const TxState &, const UpdateWalletTxFn &, bool, bool)"
                     );
      }
    }
    else {
      uVar6 = *(undefined8 *)
               &(((_Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                   *)&(_Var22._M_pi)->_vptr__Sp_counted_base)->
                super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                ).
                super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                .
                super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                ._M_u;
      uVar7 = *(undefined8 *)&(_Var22._M_pi)->_M_use_count;
      pp_Var8 = _Var22._M_pi[1]._vptr__Sp_counted_base;
      uVar9 = *(undefined8 *)&_Var22._M_pi[1]._M_use_count;
      uVar10 = *(undefined8 *)((long)&_Var22._M_pi[2]._vptr__Sp_counted_base + 1);
      *(undefined8 *)
       ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1e9) = *(undefined8 *)((long)&_Var22._M_pi[1]._M_use_count + 1);
      *(undefined8 *)
       ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1f1) = uVar10;
      *(_func_int ***)
       ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1e0) = pp_Var8;
      *(undefined8 *)
       ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1e8) = uVar9;
      *(undefined8 *)
       &(pvVar1->
        super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        ).
        super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        .
        super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
        ._M_u = uVar6;
      *(undefined8 *)
       ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x1d8) = uVar7;
      bVar11 = true;
    }
    if ((((element_type *)
         (peVar23->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start)->m_has_witness == true) &&
       (*(char *)(*(long *)((long)_Var17.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x1c0) + 0x38) == '\0')) {
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_100,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)peVar23)
      ;
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)_Var17.
                        super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                        ._M_cur + 0x1c0),&local_100);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
      bVar11 = true;
    }
  }
  else {
    iVar18 = GetTime();
    *(int *)((long)_Var17.
                   super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                   _M_cur + 0x74) = (int)iVar18;
    strCmd._M_dataplus._M_p = (pointer)IncOrderPosNext(this,&local_f0);
    *(pointer *)
     ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x80) = strCmd._M_dataplus._M_p;
    strCmd._M_string_length = (size_type)__args;
    iVar19 = std::
             _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
             ::_M_emplace_equal<std::pair<long,wallet::CWalletTx*>>
                       ((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                         *)&this->wtxOrdered,(pair<long,_wallet::CWalletTx_*> *)&strCmd);
    *(_Base_ptr *)
     ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x88) = iVar19._M_node;
    uVar13 = ComputeTimeSmart(this,__args,fFlushOnClose);
    *(uint *)((long)_Var17.
                    super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                    _M_cur + 0x78) = uVar13;
    AddToSpends(this,__args,&local_f0);
    iVar18 = CWalletTx::GetTxTime(__args);
    if (iVar18 < (this->m_birth_time).super___atomic_base<long>._M_i) {
      LOCK();
      (this->m_birth_time).super___atomic_base<long>._M_i = iVar18;
      UNLOCK();
    }
  }
  bVar12 = CWalletTx::IsCoinBase(__args);
  if ((bVar12) &&
     (*(char *)((long)_Var17.
                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                      _M_cur + 0x1f8) == '\x03')) {
    __l._M_len = 1;
    __l._M_array = (iterator)&strCmd;
    strCmd._M_dataplus._M_p = (pointer)__args;
    std::vector<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::vector
              (&txs,__l,(allocator_type *)&local_c8);
    _inactive_state = (char *)CONCAT71(uStack_107,1);
    while (txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl
           .super__Vector_impl_data._M_start !=
           txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl
           .super__Vector_impl_data._M_finish) {
      wtx = txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1];
      txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>._M_impl
           .super__Vector_impl_data._M_finish + -1;
      std::
      variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
      ::operator=((variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
                   *)&wtx->m_state,&inactive_state);
      wtx->m_amounts[0].m_cached.super__Base_bitset<1UL>._M_w = 0;
      wtx->m_amounts[1].m_cached.super__Base_bitset<1UL>._M_w = 0;
      wtx->m_amounts[2].m_cached.super__Base_bitset<1UL>._M_w = 0;
      wtx->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w = 0;
      wtx->m_is_cache_empty = true;
      wtx->fChangeCached = false;
      WalletBatch::WriteTx(&local_f0,wtx);
      MarkInputsDirty(this,&wtx->tx);
      uVar24 = 0;
      while( true ) {
        peVar4 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if ((ulong)(((long)(peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar4->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                          .super__Vector_impl_data._M_start) / 0x28) <= uVar24) break;
        strCmd._M_dataplus._M_p =
             *(pointer *)(peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        strCmd._M_string_length =
             *(size_type *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        strCmd.field_2._M_allocated_capacity =
             *(undefined8 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        strCmd.field_2._8_8_ =
             *(undefined8 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        pVar26 = std::
                 _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&(this->mapTxSpends)._M_h,(key_type *)&strCmd);
        for (_Var20._M_cur =
                  (__node_type *)
                  pVar26.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var20._M_cur !=
            pVar26.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
            _M_cur.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>;
            _Var20._M_cur = (__node_type *)((_Var20._M_cur)->super__Hash_node_base)._M_nxt) {
          iVar21 = std::
                   _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->mapWallet)._M_h,
                          (key_type *)
                          ((long)&((_Var20._M_cur)->
                                  super__Hash_node_value<std::pair<const_COutPoint,_uint256>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_COutPoint,_uint256>_>.
                                  _M_storage._M_storage + 0x24));
          if (iVar21.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur != (__node_type *)0x0) {
            local_c8._M_dataplus._M_p =
                 (pointer)((long)iVar21.
                                 super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                 ._M_cur + 0x28);
            std::vector<wallet::CWalletTx*,std::allocator<wallet::CWalletTx*>>::
            emplace_back<wallet::CWalletTx*>
                      ((vector<wallet::CWalletTx*,std::allocator<wallet::CWalletTx*>> *)&txs,
                       (CWalletTx **)&local_c8);
          }
        }
        uVar24 = (ulong)((int)uVar24 + 1);
      }
    }
    std::_Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>::~_Vector_base
              (&txs.super__Vector_base<wallet::CWalletTx_*,_std::allocator<wallet::CWalletTx_*>_>);
  }
  base_blob<256u>::ToString_abi_cxx11_(&strCmd,(base_blob<256u> *)&hash);
  local_c8._M_dataplus._M_p = "new";
  if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_c8._M_dataplus._M_p = "";
  }
  _inactive_state = "update";
  if (bVar11 == false) {
    _inactive_state = "";
  }
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/transaction.h:126:23)_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
    ::_S_vtable._M_arr[(byte)_Var22._M_pi[2]._M_use_count]._M_data)
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txs,&local_d9,
             (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              *)_Var22._M_pi);
  WalletLogPrintf<std::__cxx11::string,char_const*,char_const*,std::__cxx11::string>
            (this,(ConstevalFormatString<4U>)0x3de1d7,&strCmd,(char **)&local_c8,
             (char **)&inactive_state,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txs);
  std::__cxx11::string::~string((string *)&txs);
  std::__cxx11::string::~string((string *)&strCmd);
  if ((bVar11 == false &&
       ((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     (bVar11 = WalletBatch::WriteTx(&local_f0,__args), bVar11)) {
    *(undefined8 *)
     ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x90) = 0;
    *(undefined8 *)
     ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0xd8) = 0;
    *(undefined8 *)
     ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x120) = 0;
    *(undefined8 *)
     ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x168) = 0;
    *(undefined2 *)
     ((long)_Var17.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur + 0x1b0) = 1;
    boost::signals2::
    signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyTransactionChanged,&hash,(byte)~pVar25.second & CT_UPDATED);
    std::__cxx11::string::string((string *)&strCmd,&this->m_notify_tx_changed_script);
    if (strCmd._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txs,"%s",(allocator<char> *)&inactive_state);
      base_blob<256u>::GetHex_abi_cxx11_(&local_c8,(base_blob<256u> *)&hash);
      util::ReplaceAll(&strCmd,(string *)&txs,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&txs);
      if (*(char *)((long)_Var17.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1f8) == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%b",(allocator<char> *)&inactive_state);
        base_blob<256u>::GetHex_abi_cxx11_
                  (&local_c8,
                   (base_blob<256u> *)
                   ((long)_Var17.
                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                          ._M_cur + 0x1d0));
        util::ReplaceAll(&strCmd,(string *)&txs,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&txs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%h",(allocator<char> *)&inactive_state);
        util::ToString<int>(&local_c8,
                            (int *)((long)_Var17.
                                          super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                          ._M_cur + 0x1f0));
        util::ReplaceAll(&strCmd,(string *)&txs,&local_c8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%b",(allocator<char> *)&inactive_state);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"unconfirmed",(allocator<char> *)&local_d9);
        util::ReplaceAll(&strCmd,(string *)&txs,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&txs);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txs,"%h",(allocator<char> *)&inactive_state);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"-1",(allocator<char> *)&local_d9);
        util::ReplaceAll(&strCmd,(string *)&txs,&local_c8);
      }
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&txs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&txs,"%w",(allocator<char> *)&inactive_state);
      ShellEscape(&local_c8,&this->m_name);
      util::ReplaceAll(&strCmd,(string *)&txs,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&txs);
      std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
                ((thread *)&txs,runCommand,&strCmd);
      std::thread::detach();
      std::thread::~thread((thread *)&txs);
    }
    std::__cxx11::string::~string((string *)&strCmd);
  }
  else {
    __args = (CWalletTx *)0x0;
  }
  if (local_f0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_f0.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return __args;
}

Assistant:

CWalletTx* CWallet::AddToWallet(CTransactionRef tx, const TxState& state, const UpdateWalletTxFn& update_wtx, bool fFlushOnClose, bool rescanning_old_block)
{
    LOCK(cs_wallet);

    WalletBatch batch(GetDatabase(), fFlushOnClose);

    uint256 hash = tx->GetHash();

    if (IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE)) {
        // Mark used destinations
        std::set<CTxDestination> tx_destinations;

        for (const CTxIn& txin : tx->vin) {
            const COutPoint& op = txin.prevout;
            SetSpentKeyState(batch, op.hash, op.n, true, tx_destinations);
        }

        MarkDestinationsDirty(tx_destinations);
    }

    // Inserts only if not already there, returns tx inserted or tx found
    auto ret = mapWallet.emplace(std::piecewise_construct, std::forward_as_tuple(hash), std::forward_as_tuple(tx, state));
    CWalletTx& wtx = (*ret.first).second;
    bool fInsertedNew = ret.second;
    bool fUpdated = update_wtx && update_wtx(wtx, fInsertedNew);
    if (fInsertedNew) {
        wtx.nTimeReceived = GetTime();
        wtx.nOrderPos = IncOrderPosNext(&batch);
        wtx.m_it_wtxOrdered = wtxOrdered.insert(std::make_pair(wtx.nOrderPos, &wtx));
        wtx.nTimeSmart = ComputeTimeSmart(wtx, rescanning_old_block);
        AddToSpends(wtx, &batch);

        // Update birth time when tx time is older than it.
        MaybeUpdateBirthTime(wtx.GetTxTime());
    }

    if (!fInsertedNew)
    {
        if (state.index() != wtx.m_state.index()) {
            wtx.m_state = state;
            fUpdated = true;
        } else {
            assert(TxStateSerializedIndex(wtx.m_state) == TxStateSerializedIndex(state));
            assert(TxStateSerializedBlockHash(wtx.m_state) == TxStateSerializedBlockHash(state));
        }
        // If we have a witness-stripped version of this transaction, and we
        // see a new version with a witness, then we must be upgrading a pre-segwit
        // wallet.  Store the new version of the transaction with the witness,
        // as the stripped-version must be invalid.
        // TODO: Store all versions of the transaction, instead of just one.
        if (tx->HasWitness() && !wtx.tx->HasWitness()) {
            wtx.SetTx(tx);
            fUpdated = true;
        }
    }

    // Mark inactive coinbase transactions and their descendants as abandoned
    if (wtx.IsCoinBase() && wtx.isInactive()) {
        std::vector<CWalletTx*> txs{&wtx};

        TxStateInactive inactive_state = TxStateInactive{/*abandoned=*/true};

        while (!txs.empty()) {
            CWalletTx* desc_tx = txs.back();
            txs.pop_back();
            desc_tx->m_state = inactive_state;
            // Break caches since we have changed the state
            desc_tx->MarkDirty();
            batch.WriteTx(*desc_tx);
            MarkInputsDirty(desc_tx->tx);
            for (unsigned int i = 0; i < desc_tx->tx->vout.size(); ++i) {
                COutPoint outpoint(desc_tx->GetHash(), i);
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(outpoint);
                for (TxSpends::const_iterator it = range.first; it != range.second; ++it) {
                    const auto wit = mapWallet.find(it->second);
                    if (wit != mapWallet.end()) {
                        txs.push_back(&wit->second);
                    }
                }
            }
        }
    }

    //// debug print
    WalletLogPrintf("AddToWallet %s  %s%s %s\n", hash.ToString(), (fInsertedNew ? "new" : ""), (fUpdated ? "update" : ""), TxStateString(state));

    // Write to disk
    if (fInsertedNew || fUpdated)
        if (!batch.WriteTx(wtx))
            return nullptr;

    // Break debit/credit balance caches:
    wtx.MarkDirty();

    // Notify UI of new or updated transaction
    NotifyTransactionChanged(hash, fInsertedNew ? CT_NEW : CT_UPDATED);

#if HAVE_SYSTEM
    // notify an external script when a wallet transaction comes in or is updated
    std::string strCmd = m_notify_tx_changed_script;

    if (!strCmd.empty())
    {
        ReplaceAll(strCmd, "%s", hash.GetHex());
        if (auto* conf = wtx.state<TxStateConfirmed>())
        {
            ReplaceAll(strCmd, "%b", conf->confirmed_block_hash.GetHex());
            ReplaceAll(strCmd, "%h", ToString(conf->confirmed_block_height));
        } else {
            ReplaceAll(strCmd, "%b", "unconfirmed");
            ReplaceAll(strCmd, "%h", "-1");
        }
#ifndef WIN32
        // Substituting the wallet name isn't currently supported on windows
        // because windows shell escaping has not been implemented yet:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-537384875
        // A few ways it could be implemented in the future are described in:
        // https://github.com/bitcoin/bitcoin/pull/13339#issuecomment-461288094
        ReplaceAll(strCmd, "%w", ShellEscape(GetName()));
#endif
        std::thread t(runCommand, strCmd);
        t.detach(); // thread runs free
    }
#endif

    return &wtx;
}